

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O1

bool __thiscall DIS::SeesPdu::operator==(SeesPdu *this,SeesPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  pointer pPVar3;
  pointer pVVar4;
  long lVar5;
  ulong uVar6;
  
  bVar1 = DistributedEmissionsFamilyPdu::operator==
                    (&this->super_DistributedEmissionsFamilyPdu,
                     &rhs->super_DistributedEmissionsFamilyPdu);
  bVar2 = EntityID::operator==(&this->_orginatingEntityID,&rhs->_orginatingEntityID);
  bVar1 = (this->_radarCrossSectionSignatureRepresentationIndex ==
           rhs->_radarCrossSectionSignatureRepresentationIndex &&
          rhs->_acousticSignatureRepresentationIndex == this->_acousticSignatureRepresentationIndex)
          && (this->_infraredSignatureRepresentationIndex ==
              rhs->_infraredSignatureRepresentationIndex && (bVar2 && bVar1));
  pPVar3 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_propulsionSystemData).
      super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar2 = PropulsionSystemData::operator==
                        ((PropulsionSystemData *)((long)&pPVar3->_vptr_PropulsionSystemData + lVar5)
                         ,(PropulsionSystemData *)
                          ((long)&((rhs->_propulsionSystemData).
                                   super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                  _vptr_PropulsionSystemData + lVar5));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar6 = uVar6 + 1;
      pPVar3 = (this->_propulsionSystemData).
               super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_propulsionSystemData).
                                   super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 4));
  }
  pVVar4 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vectoringSystemData).
      super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar2 = VectoringNozzleSystemData::operator==
                        ((VectoringNozzleSystemData *)
                         ((long)&pVVar4->_vptr_VectoringNozzleSystemData + lVar5),
                         (VectoringNozzleSystemData *)
                         ((long)&((rhs->_vectoringSystemData).
                                  super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_VectoringNozzleSystemData + lVar5));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar6 = uVar6 + 1;
      pVVar4 = (this->_vectoringSystemData).
               super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_vectoringSystemData).
                                   super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4));
  }
  return bVar1;
}

Assistant:

bool SeesPdu::operator ==(const SeesPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_orginatingEntityID == rhs._orginatingEntityID) ) ivarsEqual = false;
     if( ! (_infraredSignatureRepresentationIndex == rhs._infraredSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_acousticSignatureRepresentationIndex == rhs._acousticSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_radarCrossSectionSignatureRepresentationIndex == rhs._radarCrossSectionSignatureRepresentationIndex) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _propulsionSystemData.size(); idx++)
     {
        if( ! ( _propulsionSystemData[idx] == rhs._propulsionSystemData[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _vectoringSystemData.size(); idx++)
     {
        if( ! ( _vectoringSystemData[idx] == rhs._vectoringSystemData[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }